

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symul.cpp
# Opt level: O2

vector<particle,_std::allocator<particle>_> * __thiscall symul::moveParticles(symul *this)

{
  pointer ppVar1;
  pointer ppVar2;
  int iVar3;
  pointer ppVar4;
  pair<int,_int> pVar5;
  pair<int,_int> *i_1;
  pointer ppVar6;
  pointer ppVar7;
  _State_baseV2 *__tmp_1;
  ulong uVar8;
  vector<particle,_std::allocator<particle>_> *__range1;
  long lVar9;
  particle *p_1;
  pointer ppVar10;
  vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_> *i;
  pointer this_00;
  long lVar11;
  float fVar12;
  int thrn;
  float local_f0;
  __allocator_type __a2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> collisions;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> bcoll;
  __allocator_type __a2_1;
  vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  futures;
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  splited;
  thread local_60;
  undefined8 local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  long local_48;
  __basic_future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_40;
  
  thrn = 0xf;
  ppVar10 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppVar1 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  ::vector(&splited,0xf,(allocator_type *)&futures);
  for (this_00 = splited.
                 super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_00 !=
      splited.
      super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>::reserve
              (this_00,(ulong)((long)(this->particles).
                                     super__Vector_base<particle,_std::allocator<particle>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)(this->particles).
                                     super__Vector_base<particle,_std::allocator<particle>_>._M_impl
                                     .super__Vector_impl_data._M_start >> 3) / (ulong)(long)thrn);
  }
  local_f0 = (float)(int)((ulong)((long)ppVar10 - (long)ppVar1 >> 4) / 0xf);
  lVar11 = 4;
  for (uVar8 = 0;
      ppVar10 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(this->particles).
                            super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppVar10 >> 4);
      uVar8 = uVar8 + 1) {
    fVar12 = floorf(*(float *)((long)&(ppVar10->position).x + lVar11) / local_f0);
    iVar3 = (int)fVar12;
    if (thrn <= iVar3) {
      iVar3 = thrn + -1;
    }
    futures.
    super__Vector_base<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)((long)ppVar10 + lVar11 + -4);
    futures.
    super__Vector_base<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = (int)uVar8;
    std::vector<std::pair<vec2<float>,int>,std::allocator<std::pair<vec2<float>,int>>>::
    emplace_back<std::pair<vec2<float>,int>>
              ((vector<std::pair<vec2<float>,int>,std::allocator<std::pair<vec2<float>,int>>> *)
               (splited.
                super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar3),
               (pair<vec2<float>,_int> *)&futures);
    lVar11 = lVar11 + 0x10;
  }
  lVar11 = 1;
  lVar9 = 0;
  iVar3 = thrn;
  do {
    if (iVar3 <= lVar9) {
      std::
      vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ::vector(&futures,(long)iVar3,(allocator_type *)&collisions);
      lVar9 = 0;
      for (lVar11 = 0; uVar8 = (ulong)thrn, lVar11 < (long)uVar8; lVar11 = lVar11 + 1) {
        bcoll.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        bcoll.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        ppVar4 = (pointer)operator_new(0x68);
        collisions.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)&__a2;
        ppVar4[1].first = 1;
        ppVar4[1].second = 1;
        *ppVar4 = (pair<int,_int>)&PTR___Sp_counted_ptr_inplace_00163fe0;
        ppVar4[3].first = 0;
        ppVar4[3].second = 0;
        ppVar4[4].first = 0;
        *(undefined1 *)&ppVar4[4].second = 0;
        ppVar4[5].first = 0;
        ppVar4[6].first = 0;
        ppVar4[6].second = 0;
        ppVar4[7].first = 0;
        ppVar4[2] = (pair<int,_int>)&PTR___Async_state_impl_00164030;
        collisions.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = ppVar4;
        pVar5 = (pair<int,_int>)operator_new(0x30);
        std::__future_base::
        _Result<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::_Result
                  ((_Result<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    *)pVar5);
        ppVar4[8] = pVar5;
        ppVar4[9].first = (int)lVar11;
        ppVar4[10] = (pair<int,_int>)this;
        ppVar4[0xb] = (pair<int,_int>)&thrn;
        ppVar4[0xc] = (pair<int,_int>)&splited;
        local_60._M_id._M_thread = (id)0;
        ___a2_1 = (pair<int,_int>)operator_new(0x20);
        *(undefined ***)___a2_1 = &PTR___State_00164088;
        *(pointer *)((long)___a2_1 + 8) = ppVar4 + 2;
        *(code **)((long)___a2_1 + 0x10) =
             std::__future_base::
             _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/src/symul.cpp:45:26),_int>_>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::_M_run;
        *(long *)((long)___a2_1 + 0x18) = 0;
        std::thread::_M_start_thread(&local_60,&__a2_1,0);
        if (___a2_1 != (pair<int,_int>)0x0) {
          (**(code **)(*(long *)___a2_1 + 8))();
        }
        std::thread::operator=((thread *)(ppVar4 + 6),&local_60);
        std::thread::~thread(&local_60);
        collisions.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/src/symul.cpp:45:26),_int>_>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/src/symul.cpp:45:26),_int>_>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_aaamp[P]entropy_experiment_src_symul_cpp:45:26),_int>_>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_aaamp[P]entropy_experiment_src_symul_cpp:45:26),_int>_>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&collisions);
        local_58 = 0;
        _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        collisions.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             bcoll.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        collisions.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             bcoll.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        bcoll.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
        .super__Vector_impl_data._M_start = ppVar4 + 2;
        bcoll.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar4;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &collisions.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
        if (bcoll.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          ppVar4 = (pointer)operator_new(0x58);
          collisions.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)&__a2_1;
          ppVar4[1].first = 1;
          ppVar4[1].second = 1;
          *ppVar4 = (pair<int,_int>)&PTR___Sp_counted_ptr_inplace_001640c8;
          ppVar4[3].first = 0;
          ppVar4[3].second = 0;
          ppVar4[4].first = 0;
          *(undefined1 *)&ppVar4[4].second = 0;
          ppVar4[5].first = 0;
          ppVar4[2] = (pair<int,_int>)&PTR___Deferred_state_00164118;
          collisions.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar4;
          pVar5 = (pair<int,_int>)operator_new(0x30);
          std::__future_base::
          _Result<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::_Result
                    ((_Result<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      *)pVar5);
          ppVar4[6] = pVar5;
          ppVar4[7].first = (int)lVar11;
          ppVar4[8] = (pair<int,_int>)this;
          ppVar4[9] = (pair<int,_int>)&thrn;
          ppVar4[10] = (pair<int,_int>)&splited;
          collisions.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          std::
          __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/src/symul.cpp:45:26),_int>_>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/src/symul.cpp:45:26),_int>_>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
          ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_aaamp[P]entropy_experiment_src_symul_cpp:45:26),_int>_>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_aaamp[P]entropy_experiment_src_symul_cpp:45:26),_int>_>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                              *)&collisions);
          local_58 = 0;
          _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          collisions.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               bcoll.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          collisions.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               bcoll.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          bcoll.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4 + 2;
          bcoll.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar4;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &collisions.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
        }
        std::
        __basic_future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
        __basic_future(&local_40,(__state_type *)&bcoll);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &bcoll.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
        std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
        operator=((future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   *)((long)&((futures.
                               super__Vector_base<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___basic_future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                             )._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + lVar9),
                  (future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   *)&local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_40._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        lVar9 = lVar9 + 0x10;
      }
      collisions.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      collisions.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      collisions.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar9 = 0;
      for (lVar11 = 0; lVar11 < (int)uVar8; lVar11 = lVar11 + 1) {
        std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::get
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &bcoll.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,
                   (future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    *)((long)&((futures.
                                super__Vector_base<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super___basic_future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                              )._M_state.
                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + lVar9));
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        insert<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,void>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&collisions,
                   (const_iterator)
                   collisions.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    )bcoll.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    )bcoll.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                  (&bcoll.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
        uVar8 = (ulong)(uint)thrn;
        lVar9 = lVar9 + 0x10;
      }
      std::
      shuffle<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )collisions.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )collisions.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&this->mt_rand);
      ppVar4 = collisions.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (ppVar7 = collisions.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar4; ppVar7 = ppVar7 + 1)
      {
        ppVar10 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
                  super__Vector_impl_data._M_start;
        particle::collideWith(ppVar10 + ppVar7->first,ppVar10 + ppVar7->second);
      }
      ppVar1 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (ppVar10 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar1;
          ppVar10 = ppVar10 + 1) {
        particle::collideBox(ppVar10,&this->box,&this->particleR);
      }
      ppVar1 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (ppVar10 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar1;
          ppVar10 = ppVar10 + 1) {
        particle::update(ppVar10,this->timeTick);
      }
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&collisions.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
      std::
      vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ::~vector(&futures);
      std::
      vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
      ::~vector(&splited);
      return &this->particles;
    }
    fVar12 = this->particleR;
    local_f0 = fVar12 + fVar12 +
               splited.
               super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar9].
               super__Vector_base<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].first.y;
    local_48 = lVar11;
    for (; (int)lVar11 < iVar3; lVar11 = lVar11 + 1) {
      ppVar2 = splited.
               super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar11].
               super__Vector_base<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar6 = splited.
                    super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar11].
                    super__Vector_base<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar2; ppVar6 = ppVar6 + 1
          ) {
        futures.
        super__Vector_base<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = *(pointer *)&ppVar6->first;
        futures.
        super__Vector_base<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ = ppVar6->second;
        if (local_f0 <
            futures.
            super__Vector_base<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_) break;
        std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>::
        push_back(splited.
                  super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar9,(value_type *)&futures);
      }
      iVar3 = thrn;
    }
    lVar11 = local_48 + 1;
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

const std::vector<particle>& symul::moveParticles()
{
    using posind = std::vector<std::pair<vec2f, int>>; 

    // number of threads == number of buckets
    int thrn = 15;

    // put positions in thrn buckets by their Y
    int buckLen = particles.size() / thrn;
    std::vector<posind> splited(thrn);
    for(auto& i : splited)
        i.reserve(particles.size() * 2 / thrn);
    for(int i = 0; i < particles.size(); i++)
    {
        int mybucket = static_cast<int>(std::floor(particles[i].getPosition().getY() / buckLen));
        if(mybucket >= thrn)
            mybucket = thrn - 1;
        splited[mybucket].push_back(std::make_pair(particles[i].getPosition(), i));
    }
    // put particles close to bucket edge in multiple buckets
    for(int b = 0; b < thrn; b++)
    {
        float myend = splited[b].back().first.getY() + particleR * 2;
        for(int other = b + 1; other < thrn; other++)
        {
            for(auto p : splited[other])
            {
                if(p.first.getY() > myend)
                    break;
                splited[b].push_back(p);
            }
        }
    }

    // function that returns collisions from one bucket
    auto getCollisions = [&](int b)
    {
        std::vector<std::pair<int, int>> myCollisions;    
        myCollisions.reserve(particles.size() * 2 / thrn);

        std::sort(splited[b].begin(), splited[b].end(), [](auto x, auto y)
        { 
            return x.first.getX() < y.first.getX();
        });

        auto startj = splited[b].begin();
        for(auto i = splited[b].begin(); i < splited[b].end(); i++)
        {
            while(startj < i && startj->first.getX() < i->first.getX() - particleR * 2)
                startj++;
            for(auto j = startj; j < i; j++)
            {
                if((j->first - i->first).getLength() < 2 * particleR)
                    myCollisions.push_back(std::make_pair(i->second, j->second));
            }
        }
        return myCollisions;
    };

    // get collisions
    std::vector<std::future<std::vector<std::pair<int, int>>>> futures(thrn);
    for(int i = 0; i < thrn; i++)
    {
        futures[i] = std::async(std::launch::async, getCollisions, i);
    }

    // get collisions in one vector
    std::vector<std::pair<int, int>> collisions;
    for(int i = 0; i < thrn; i++)
    {
        auto bcoll = futures[i].get();
        collisions.insert(collisions.end(), bcoll.begin(), bcoll.end());
    }

    // shuffle collisions
    std::shuffle(collisions.begin(), collisions.end(), mt_rand);

    // apply collisions
    for(auto& i : collisions)
        particles[i.first].collideWith(particles[i.second]);
    
    // collide with box
    for(auto& i : particles)
        i.collideBox(box, particleR);

    // update position
    for(auto& p : particles)
        p.update(timeTick);

    //std::cerr << "collisions: " << collisions.size() << std::endl;

    return particles;
}